

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::LifetimeTests::details::RboFboAttacher::attach
          (RboFboAttacher *this,GLuint rbo,GLuint fbo)

{
  ContextWrapper *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  this_00 = &(this->super_FboAttacher).super_Attacher.super_ContextWrapper;
  glu::CallLogWrapper::glBindFramebuffer(&this_00->super_CallLogWrapper,0x8d40,fbo);
  iVar1 = (*((this->super_FboAttacher).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer(GL_FRAMEBUFFER, fbo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x17c);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&this_00->super_CallLogWrapper,0x8d40,0x8ce0,0x8d41,rbo);
  iVar1 = (*((this->super_FboAttacher).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  dVar2 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(dVar2,
                  "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x17f);
  glu::CallLogWrapper::glBindFramebuffer(&this_00->super_CallLogWrapper,0x8d40,0);
  iVar1 = (*((this->super_FboAttacher).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  dVar2 = (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer(GL_FRAMEBUFFER, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x182);
  return;
}

Assistant:

void RboFboAttacher::attach (GLuint rbo, GLuint fbo)
{
	GLU_CHECK_CALL_ERROR(
		glBindFramebuffer(GL_FRAMEBUFFER, fbo),
		gl().getError());
	GLU_CHECK_CALL_ERROR(
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo),
		gl().getError());
	GLU_CHECK_CALL_ERROR(
		glBindFramebuffer(GL_FRAMEBUFFER, 0),
		gl().getError());
}